

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O0

void __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::clear
          (image<crnlib::color_quad<unsigned_char,_int>_> *this)

{
  vector<crnlib::color_quad<unsigned_char,_int>_> *in_RDI;
  
  in_RDI[1].m_size = 0;
  in_RDI[1].m_capacity = 0;
  vector<crnlib::color_quad<unsigned_char,_int>_>::clear(in_RDI);
  *(undefined4 *)&in_RDI->m_p = 0;
  *(undefined4 *)((long)&in_RDI->m_p + 4) = 0;
  in_RDI->m_size = 0;
  in_RDI->m_capacity = 0;
  *(undefined4 *)&in_RDI[1].m_p = 0xf;
  return;
}

Assistant:

void clear() {
    m_pPixels = NULL;
    m_pixel_buf.clear();
    m_width = 0;
    m_height = 0;
    m_pitch = 0;
    m_total = 0;
    m_comp_flags = pixel_format_helpers::cDefaultCompFlags;
  }